

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2.cpp
# Opt level: O0

void enumEitherTrie(UTrie2 *trie,UChar32 start,UChar32 limit,UTrie2EnumValue *enumValue,
                   UTrie2EnumRange *enumRange,void *context)

{
  UChar32 UVar1;
  UBool UVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  uint32_t uVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar7;
  uint local_a8;
  uint local_a4;
  UChar32 local_90;
  UChar32 local_8c;
  uint local_84;
  uint local_80;
  uint32_t highValue;
  int32_t i2Limit;
  int32_t i2;
  UChar32 tempLimit;
  int32_t nullBlock;
  int32_t prevBlock;
  int32_t block;
  int32_t index2NullOffset;
  int32_t prevI2Block;
  int32_t i2Block;
  int32_t j;
  UChar32 highStart;
  UChar32 prev;
  UChar32 c;
  uint32_t initialValue;
  uint32_t prevValue;
  uint32_t value;
  uint16_t *idx;
  uint32_t *data32;
  void *context_local;
  UTrie2EnumRange *enumRange_local;
  UTrie2EnumValue *enumValue_local;
  UChar32 limit_local;
  UChar32 start_local;
  UTrie2 *trie_local;
  
  if (enumRange != (UTrie2EnumRange *)0x0) {
    enumRange_local = (UTrie2EnumRange *)enumValue;
    if (enumValue == (UTrie2EnumValue *)0x0) {
      enumRange_local = enumSameValue;
    }
    if (trie->newTrie == (UNewTrie2 *)0x0) {
      _prevValue = trie->index;
      idx = (uint16_t *)trie->data32;
      prevBlock = (int32_t)trie->index2NullOffset;
      i2 = (int32_t)trie->dataNullOffset;
    }
    else {
      _prevValue = (uint16_t *)0x0;
      idx = (uint16_t *)trie->newTrie->data;
      prevBlock = trie->newTrie->index2NullOffset;
      i2 = trie->newTrie->dataNullOffset;
    }
    iVar5 = trie->highStart;
    UVar2 = (*enumRange_local)(context,trie->initialValue,limit,(uint32_t)trie);
    iVar3 = (int)CONCAT71(extraout_var,UVar2);
    block = -1;
    tempLimit = -1;
    c = 0;
    uVar7 = extraout_RDX;
    j = start;
    highStart = start;
LAB_004001d5:
    if (highStart < limit && highStart < iVar5) {
      i2Limit = highStart + 0x800;
      if (limit < i2Limit) {
        i2Limit = limit;
      }
      iVar4 = highStart >> 0xb;
      if (highStart < 0x10000) {
        index2NullOffset = highStart >> 5;
        if ((highStart & 0xfffff800U) == 0xd800) {
          if ((highStart & 0x400U) == 0) {
            index2NullOffset = 0x800;
            local_8c = limit;
            if (0xdc00 < limit) {
              local_8c = 0xdc00;
            }
            i2Limit = local_8c;
          }
          else {
            index2NullOffset = 0x6c0;
            local_90 = limit;
            if (0xe000 < limit) {
              local_90 = 0xe000;
            }
            i2Limit = local_90;
          }
        }
      }
      else {
        if (_prevValue == (uint16_t *)0x0) {
          index2NullOffset = trie->newTrie->index1[iVar4];
        }
        else {
          index2NullOffset = (int32_t)_prevValue[iVar4 + 0x820];
        }
        if ((index2NullOffset == block) && (0x7ff < highStart - j)) {
          highStart = highStart + 0x800;
          goto LAB_004001d5;
        }
      }
      block = index2NullOffset;
      if (index2NullOffset == prevBlock) {
        if (c != iVar3) {
          if ((j < highStart) &&
             (UVar2 = (*enumRange)(context,j,highStart + -1,c), uVar7 = extraout_RDX_00,
             UVar2 == '\0')) {
            return;
          }
          tempLimit = i2;
          j = highStart;
          c = iVar3;
        }
        highStart = highStart + 0x800;
      }
      else {
        highValue = highStart >> 5 & 0x3f;
        if (iVar4 == i2Limit >> 0xb) {
          local_80 = i2Limit >> 5 & 0x3f;
        }
        else {
          local_80 = 0x40;
        }
        for (; (int)highValue < (int)local_80; highValue = highValue + 1) {
          if (_prevValue == (uint16_t *)0x0) {
            nullBlock = trie->newTrie->index2[(int)(index2NullOffset + highValue)];
          }
          else {
            nullBlock = (uint)_prevValue[(int)(index2NullOffset + highValue)] << 2;
          }
          if ((nullBlock == tempLimit) && (0x1f < highStart - j)) {
            highStart = highStart + 0x20;
          }
          else {
            tempLimit = nullBlock;
            if (nullBlock == i2) {
              if (c != iVar3) {
                if ((j < highStart) &&
                   (UVar2 = (*enumRange)(context,j,highStart + -1,c), uVar7 = extraout_RDX_01,
                   UVar2 == '\0')) {
                  return;
                }
                j = highStart;
                c = iVar3;
              }
              highStart = highStart + 0x20;
            }
            else {
              for (prevI2Block = 0; prevI2Block < 0x20; prevI2Block = prevI2Block + 1) {
                if (idx == (uint16_t *)0x0) {
                  local_a4 = (uint)_prevValue[nullBlock + prevI2Block];
                }
                else {
                  local_a4 = *(uint *)(idx + (long)(nullBlock + prevI2Block) * 2);
                }
                UVar2 = (*enumRange_local)(context,local_a4,(UChar32)uVar7,nullBlock + prevI2Block);
                iVar4 = (int)CONCAT71(extraout_var_00,UVar2);
                uVar7 = extraout_RDX_02;
                if (iVar4 != c) {
                  if ((j < highStart) &&
                     (UVar2 = (*enumRange)(context,j,highStart + -1,c), uVar7 = extraout_RDX_03,
                     UVar2 == '\0')) {
                    return;
                  }
                  j = highStart;
                  c = iVar4;
                }
                highStart = highStart + 1;
              }
            }
          }
        }
      }
      goto LAB_004001d5;
    }
    UVar1 = limit;
    if ((highStart <= limit) && (UVar1 = highStart, highStart < limit)) {
      if (_prevValue == (uint16_t *)0x0) {
        uVar6 = trie->newTrie->dataLength - 4;
        local_84 = trie->newTrie->data[(int)uVar6];
      }
      else {
        if (idx == (uint16_t *)0x0) {
          uVar6 = trie->highValueIndex;
          local_a8 = (uint)_prevValue[(int)uVar6];
        }
        else {
          uVar6 = trie->highValueIndex;
          local_a8 = *(uint *)(idx + (long)(int)uVar6 * 2);
        }
        local_84 = local_a8;
      }
      UVar2 = (*enumRange_local)(context,local_84,(UChar32)uVar7,uVar6);
      iVar5 = (int)CONCAT71(extraout_var_01,UVar2);
      UVar1 = limit;
      if (iVar5 != c) {
        if ((j < highStart) && (UVar2 = (*enumRange)(context,j,highStart + -1,c), UVar2 == '\0')) {
          return;
        }
        j = highStart;
        UVar1 = limit;
        c = iVar5;
      }
    }
    highStart = UVar1;
    (*enumRange)(context,j,highStart + -1,c);
  }
  return;
}

Assistant:

static void
enumEitherTrie(const UTrie2 *trie,
               UChar32 start, UChar32 limit,
               UTrie2EnumValue *enumValue, UTrie2EnumRange *enumRange, const void *context) {
    const uint32_t *data32;
    const uint16_t *idx;

    uint32_t value, prevValue, initialValue;
    UChar32 c, prev, highStart;
    int32_t j, i2Block, prevI2Block, index2NullOffset, block, prevBlock, nullBlock;

    if(enumRange==NULL) {
        return;
    }
    if(enumValue==NULL) {
        enumValue=enumSameValue;
    }

    if(trie->newTrie==NULL) {
        /* frozen trie */
        idx=trie->index;
        U_ASSERT(idx!=NULL); /* the following code assumes trie->newTrie is not NULL when idx is NULL */
        data32=trie->data32;

        index2NullOffset=trie->index2NullOffset;
        nullBlock=trie->dataNullOffset;
    } else {
        /* unfrozen, mutable trie */
        idx=NULL;
        data32=trie->newTrie->data;
        U_ASSERT(data32!=NULL); /* the following code assumes idx is not NULL when data32 is NULL */

        index2NullOffset=trie->newTrie->index2NullOffset;
        nullBlock=trie->newTrie->dataNullOffset;
    }

    highStart=trie->highStart;

    /* get the enumeration value that corresponds to an initial-value trie data entry */
    initialValue=enumValue(context, trie->initialValue);

    /* set variables for previous range */
    prevI2Block=-1;
    prevBlock=-1;
    prev=start;
    prevValue=0;

    /* enumerate index-2 blocks */
    for(c=start; c<limit && c<highStart;) {
        /* Code point limit for iterating inside this i2Block. */
        UChar32 tempLimit=c+UTRIE2_CP_PER_INDEX_1_ENTRY;
        if(limit<tempLimit) {
            tempLimit=limit;
        }
        if(c<=0xffff) {
            if(!U_IS_SURROGATE(c)) {
                i2Block=c>>UTRIE2_SHIFT_2;
            } else if(U_IS_SURROGATE_LEAD(c)) {
                /*
                 * Enumerate values for lead surrogate code points, not code units:
                 * This special block has half the normal length.
                 */
                i2Block=UTRIE2_LSCP_INDEX_2_OFFSET;
                tempLimit=MIN_VALUE(0xdc00, limit);
            } else {
                /*
                 * Switch back to the normal part of the index-2 table.
                 * Enumerate the second half of the surrogates block.
                 */
                i2Block=0xd800>>UTRIE2_SHIFT_2;
                tempLimit=MIN_VALUE(0xe000, limit);
            }
        } else {
            /* supplementary code points */
            if(idx!=NULL) {
                i2Block=idx[(UTRIE2_INDEX_1_OFFSET-UTRIE2_OMITTED_BMP_INDEX_1_LENGTH)+
                              (c>>UTRIE2_SHIFT_1)];
            } else {
                i2Block=trie->newTrie->index1[c>>UTRIE2_SHIFT_1];
            }
            if(i2Block==prevI2Block && (c-prev)>=UTRIE2_CP_PER_INDEX_1_ENTRY) {
                /*
                 * The index-2 block is the same as the previous one, and filled with prevValue.
                 * Only possible for supplementary code points because the linear-BMP index-2
                 * table creates unique i2Block values.
                 */
                c+=UTRIE2_CP_PER_INDEX_1_ENTRY;
                continue;
            }
        }
        prevI2Block=i2Block;
        if(i2Block==index2NullOffset) {
            /* this is the null index-2 block */
            if(prevValue!=initialValue) {
                if(prev<c && !enumRange(context, prev, c-1, prevValue)) {
                    return;
                }
                prevBlock=nullBlock;
                prev=c;
                prevValue=initialValue;
            }
            c+=UTRIE2_CP_PER_INDEX_1_ENTRY;
        } else {
            /* enumerate data blocks for one index-2 block */
            int32_t i2, i2Limit;
            i2=(c>>UTRIE2_SHIFT_2)&UTRIE2_INDEX_2_MASK;
            if((c>>UTRIE2_SHIFT_1)==(tempLimit>>UTRIE2_SHIFT_1)) {
                i2Limit=(tempLimit>>UTRIE2_SHIFT_2)&UTRIE2_INDEX_2_MASK;
            } else {
                i2Limit=UTRIE2_INDEX_2_BLOCK_LENGTH;
            }
            for(; i2<i2Limit; ++i2) {
                if(idx!=NULL) {
                    block=(int32_t)idx[i2Block+i2]<<UTRIE2_INDEX_SHIFT;
                } else {
                    block=trie->newTrie->index2[i2Block+i2];
                }
                if(block==prevBlock && (c-prev)>=UTRIE2_DATA_BLOCK_LENGTH) {
                    /* the block is the same as the previous one, and filled with prevValue */
                    c+=UTRIE2_DATA_BLOCK_LENGTH;
                    continue;
                }
                prevBlock=block;
                if(block==nullBlock) {
                    /* this is the null data block */
                    if(prevValue!=initialValue) {
                        if(prev<c && !enumRange(context, prev, c-1, prevValue)) {
                            return;
                        }
                        prev=c;
                        prevValue=initialValue;
                    }
                    c+=UTRIE2_DATA_BLOCK_LENGTH;
                } else {
                    for(j=0; j<UTRIE2_DATA_BLOCK_LENGTH; ++j) {
                        value=enumValue(context, data32!=NULL ? data32[block+j] : idx[block+j]);
                        if(value!=prevValue) {
                            if(prev<c && !enumRange(context, prev, c-1, prevValue)) {
                                return;
                            }
                            prev=c;
                            prevValue=value;
                        }
                        ++c;
                    }
                }
            }
        }
    }

    if(c>limit) {
        c=limit;  /* could be higher if in the index2NullOffset */
    } else if(c<limit) {
        /* c==highStart<limit */
        uint32_t highValue;
        if(idx!=NULL) {
            highValue=
                data32!=NULL ?
                    data32[trie->highValueIndex] :
                    idx[trie->highValueIndex];
        } else {
            highValue=trie->newTrie->data[trie->newTrie->dataLength-UTRIE2_DATA_GRANULARITY];
        }
        value=enumValue(context, highValue);
        if(value!=prevValue) {
            if(prev<c && !enumRange(context, prev, c-1, prevValue)) {
                return;
            }
            prev=c;
            prevValue=value;
        }
        c=limit;
    }

    /* deliver last range */
    enumRange(context, prev, c-1, prevValue);
}